

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuX11.cpp
# Opt level: O3

void __thiscall tcu::x11::XlibDisplay::processEvents(XlibDisplay *this)

{
  int iVar1;
  XEvent event;
  int local_d0 [14];
  uint local_98;
  
  iVar1 = XPending(this->m_display);
  if (iVar1 != 0) {
    do {
      XNextEvent(this->m_display,local_d0);
      if ((local_d0[0] == 0x21) && ((ulong)local_98 == this->m_deleteAtom)) {
        EventState::setQuitFlag((this->super_DisplayBase).m_eventState,true);
      }
      iVar1 = XPending(this->m_display);
    } while (iVar1 != 0);
  }
  return;
}

Assistant:

void XlibDisplay::processEvents (void)
{
	XEvent	event;

	while (XPending(m_display))
	{
		XNextEvent(m_display, &event);
		processEvent(event);
	}
}